

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall
cmGeneratorTarget::NeedDyndepForSource
          (cmGeneratorTarget *this,string *lang,string *config,cmSourceFile *sf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *piVar2;
  long *plVar3;
  cmGlobalGenerator *pcVar4;
  bool bVar5;
  Cxx20SupportLevel CVar6;
  int iVar7;
  PolicyStatus PVar8;
  cmFileSet *pcVar9;
  cmValue cVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *pcVar11;
  string_view value;
  string_view value_00;
  string_view value_01;
  string local_48;
  
  piVar2 = (int *)(lang->_M_dataplus)._M_p;
  if (lang->_M_string_length == 3) {
    if (*(char *)((long)piVar2 + 2) == 'X' && (short)*piVar2 == 0x5843) {
      pcVar9 = GetFileSetForSource(this,config,sf);
      if (((pcVar9 != (cmFileSet *)0x0) && ((pcVar9->Type)._M_string_length == 0xb)) &&
         (plVar3 = (long *)(pcVar9->Type)._M_dataplus._M_p,
         *(long *)((long)plVar3 + 3) == 0x53454c55444f4d5f && *plVar3 == 0x55444f4d5f585843)) {
        return true;
      }
      CVar6 = HaveCxxModuleSupport(this,config);
      if (CVar6 < MissingRule) {
        return false;
      }
      pcVar4 = this->LocalGenerator->GlobalGenerator;
      iVar7 = (*pcVar4->_vptr_cmGlobalGenerator[0xe])(pcVar4,1);
      paVar1 = &local_48.field_2;
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CXX_SCAN_FOR_MODULES","")
      ;
      cVar10 = cmSourceFile::GetProperty(sf,&local_48);
      pcVar11 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        pcVar11 = extraout_RDX_00;
      }
      if (((cVar10.Value == (string *)0x0) ||
          ((cmValue *)(cVar10.Value)->_M_string_length == (cmValue *)0x0)) ||
         (value._M_str = pcVar11, value._M_len = (size_t)((cVar10.Value)->_M_dataplus)._M_p,
         bVar5 = cmValue::IsNOTFOUND((cmValue *)(cVar10.Value)->_M_string_length,value),
         pcVar11 = extraout_RDX_01, bVar5)) {
        local_48._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"CXX_SCAN_FOR_MODULES","");
        cVar10 = GetProperty(this,&local_48);
        pcVar11 = extraout_RDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != paVar1) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          pcVar11 = extraout_RDX_03;
        }
        if (((cVar10.Value == (string *)0x0) ||
            ((cmValue *)(cVar10.Value)->_M_string_length == (cmValue *)0x0)) ||
           (value_00._M_str = pcVar11, value_00._M_len = (size_t)((cVar10.Value)->_M_dataplus)._M_p,
           bVar5 = cmValue::IsNOTFOUND((cmValue *)(cVar10.Value)->_M_string_length,value_00),
           pcVar11 = extraout_RDX_04, bVar5)) {
          PVar8 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0155);
          return (bool)(CVar6 != MissingRule & (byte)iVar7 & PVar8 - NEW < 3);
        }
      }
      value_01._M_str = pcVar11;
      value_01._M_len = (size_t)((cVar10.Value)->_M_dataplus)._M_p;
      bVar5 = cmValue::IsOn((cmValue *)(cVar10.Value)->_M_string_length,value_01);
      return bVar5;
    }
  }
  else if ((lang->_M_string_length == 7) &&
          (*(int *)((long)piVar2 + 3) == 0x6e617274 && *piVar2 == 0x74726f46)) {
    return true;
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::NeedDyndepForSource(std::string const& lang,
                                            std::string const& config,
                                            cmSourceFile const* sf) const
{
  // Fortran always needs to be scanned.
  if (lang == "Fortran"_s) {
    return true;
  }
  // Only C++ code needs scanned otherwise.
  if (lang != "CXX"_s) {
    return false;
  }

  // Any file in `CXX_MODULES` file sets need scanned (it being `CXX` is
  // enforced elsewhere).
  auto const* fs = this->GetFileSetForSource(config, sf);
  if (fs && fs->GetType() == "CXX_MODULES"_s) {
    return true;
  }

  bool haveRule = false;
  switch (this->HaveCxxModuleSupport(config)) {
    case Cxx20SupportLevel::MissingCxx:
    case Cxx20SupportLevel::NoCxx20:
      return false;
    case Cxx20SupportLevel::MissingRule:
      break;
    case Cxx20SupportLevel::Supported:
      haveRule = true;
      break;
  }
  bool haveGeneratorSupport =
    this->GetGlobalGenerator()->CheckCxxModuleSupport(
      cmGlobalGenerator::CxxModuleSupportQuery::Inspect);
  auto const sfProp = sf->GetProperty("CXX_SCAN_FOR_MODULES");
  if (sfProp.IsSet()) {
    return sfProp.IsOn();
  }
  auto const tgtProp = this->GetProperty("CXX_SCAN_FOR_MODULES");
  if (tgtProp.IsSet()) {
    return tgtProp.IsOn();
  }

  bool policyAnswer = false;
  switch (this->GetPolicyStatusCMP0155()) {
    case cmPolicies::WARN:
    case cmPolicies::OLD:
      // The OLD behavior is to not scan the source.
      policyAnswer = false;
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      // The NEW behavior is to scan the source if the compiler supports
      // scanning and the generator supports it.
      policyAnswer = haveRule && haveGeneratorSupport;
      break;
  }
  return policyAnswer;
}